

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::ParseOneMapEntry
                 (NodeBase *node,char *ptr,ParseContext *ctx,FieldAux *aux,TcParseTableBase *table,
                 FieldEntry *entry,UntypedMapBase *map)

{
  undefined8 *puVar1;
  FieldAux *this;
  ParseContext *pPVar2;
  ParseContext *p;
  string *psVar3;
  bool bVar4;
  int8_t iVar5;
  byte bVar6;
  unsigned_short uVar7;
  int iVar8;
  int iVar9;
  uint32_t uVar10;
  char *pcVar11;
  LogMessage *pLVar12;
  TcParseTableBase *this_00;
  ulong uVar13;
  TailCallParseFunc p_Var14;
  TcParseTableBase *pTVar15;
  string_view str_00;
  string_view message_name;
  undefined1 auVar16 [16];
  string_view field_name;
  undefined1 in_stack_fffffffffffffb58;
  string **local_3e8;
  FieldAux **local_3e0;
  TcParseTableBase **local_3d8;
  LogMessage local_3d0;
  Voidify local_3be;
  uchar local_3bd;
  uint local_3bc;
  Nullable<const_char_*> local_3b8;
  Nullable<const_char_*> absl_log_internal_check_op_result_1;
  LogMessage local_3a0;
  Voidify local_389;
  Nullable<const_char_*> local_388;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  char *local_378;
  string_view local_370;
  undefined1 local_360 [16];
  byte local_349;
  string *psStack_348;
  bool do_utf8_check;
  string *str;
  int size;
  uint32_t v;
  uint64_t tmp;
  string *local_328;
  void *obj;
  TypeKind type_kind;
  MapTypeCard type_card;
  uint32_t inner_tag;
  uint8_t value_tag;
  uint8_t key_tag;
  FieldEntry *pFStack_310;
  MapAuxInfo map_info;
  FieldEntry *entry_local;
  TcParseTableBase *table_local;
  FieldAux *aux_local;
  ParseContext *ctx_local;
  char *ptr_local;
  NodeBase *node_local;
  ulong local_2d8;
  int64_t res;
  ParseContext *local_2c8;
  LimitToken local_2bc;
  LogMessage local_2b8;
  Voidify local_2a1;
  Nullable<const_char_*> local_2a0;
  Nullable<const_char_*> absl_log_internal_check_op_result_2;
  undefined4 local_290;
  int old_depth;
  LimitToken local_27c;
  string ***pppsStack_278;
  LimitToken old;
  ParseContext *local_260;
  undefined1 local_248 [12];
  int size_1;
  ParseContext *local_238;
  FieldAux *local_230;
  ParseContext *local_228;
  ulong local_220;
  int64_t res3;
  int64_t res2;
  anon_class_8_1_54a39810 last;
  anon_class_8_1_54a39810 next;
  bool kIs32BitVarint;
  bool kIs64BitVarint;
  ParseContext *local_1f0;
  ParseContext *local_1e8;
  int64_t *local_1e0;
  int8_t local_1c9;
  ulong *local_1c8;
  int8_t local_1b1;
  int64_t *local_1b0;
  int8_t local_199;
  ulong *local_198;
  int8_t local_181;
  int8_t local_171;
  int8_t local_161;
  int8_t local_151;
  int8_t local_141;
  int64_t *local_140;
  int8_t local_129;
  ulong *local_128;
  int8_t local_111;
  int64_t *local_110;
  int8_t local_f9;
  ulong *local_f8;
  int8_t local_e1;
  int8_t local_d1;
  int8_t local_c1;
  int8_t local_b1;
  int8_t local_a1;
  ParseContext *local_a0;
  string ***local_98;
  TcFieldData local_90;
  TcParseTableBase *local_88;
  ParseContext *local_80;
  ParseContext *local_78;
  string *local_70;
  ParseContext *local_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcFieldData data;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  
  unique0x00011f80 = (aux->enum_range).first;
  inner_tag._3_1_ = (byte)(aux->enum_range).last;
  pFStack_310 = entry;
  table_local = (TcParseTableBase *)aux;
  aux_local = (FieldAux *)ctx;
  ctx_local = (ParseContext *)ptr;
  ptr_local = (char *)node;
  type_card.tag_ = MapTypeCard::tag((MapTypeCard *)&type_card.field_0x1);
  type_kind = MapTypeCard::tag((MapTypeCard *)((long)&inner_tag + 1));
  do {
    while( true ) {
      bVar4 = ParseContext::Done((ParseContext *)&aux_local->enum_range,(char **)&ctx_local);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        return (char *)ctx_local;
      }
      obj._4_4_ = (uint)*(char *)&(ctx_local->super_EpsCopyInputStream).limit_end_;
      if (obj._4_4_ == type_card.tag_ || obj._4_4_ == type_kind) break;
      ctx_local = (ParseContext *)ReadTag((char *)ctx_local,(uint32_t *)((long)&obj + 4),0);
      if (obj._4_4_ == type_card.tag_ || obj._4_4_ == type_kind) goto LAB_004e4922;
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      if ((obj._4_4_ == 0) || ((obj._4_4_ & 7) == 4)) {
        EpsCopyInputStream::SetLastTag((EpsCopyInputStream *)&aux_local->enum_range,obj._4_4_);
        return (char *)ctx_local;
      }
      ctx_local = (ParseContext *)
                  UnknownFieldParse(obj._4_4_,(string *)0x0,(char *)ctx_local,
                                    (ParseContext *)&aux_local->enum_range);
      if (ctx_local == (ParseContext *)0x0) {
        return (char *)0x0;
      }
    }
    ctx_local = (ParseContext *)((long)&(ctx_local->super_EpsCopyInputStream).limit_end_ + 1);
LAB_004e4922:
    if (obj._4_4_ == type_card.tag_) {
      obj._2_2_ = stack0xfffffffffffffceb;
      tmp._4_4_ = UntypedMapBase::type_info(map);
      obj._1_1_ = UntypedMapBase::TypeInfo::key_type_kind((TypeInfo *)((long)&tmp + 4));
      local_328 = (string *)NodeBase::GetVoidKey((NodeBase *)ptr_local);
    }
    else {
      obj._2_2_ = inner_tag._1_2_;
      tmp._0_4_ = UntypedMapBase::type_info(map);
      obj._1_1_ = UntypedMapBase::TypeInfo::value_type_kind((TypeInfo *)&tmp);
      local_328 = (string *)UntypedMapBase::GetVoidValue(map,(NodeBase *)ptr_local);
    }
    switch(obj._4_4_ & 7) {
    case 0:
      local_2c8 = ctx_local;
      res = (int64_t)&size;
      local_1f0 = ctx_local;
      last.p = (char **)&local_1f0;
      res2 = (int64_t)&local_1f0;
      iVar5 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()(&last);
      local_2d8 = (ulong)iVar5;
      if (iVar5 < '\0') {
        local_1c9 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                              (&last);
        local_1e0 = &res3;
        res3 = (long)local_1c9 << 7 | local_2d8 >> 0x39;
        local_171 = local_1c9;
        if (res3 < 0) {
          local_1b1 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                (&last);
          local_1c8 = &local_220;
          local_220 = (long)local_1b1 << 0xe | local_2d8 >> 0x32;
          local_161 = local_1b1;
          if ((long)local_220 < 0) {
            local_199 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::operator()
                                  (&last);
            local_1b0 = &res3;
            res3 = ((long)local_199 << 0x15 | local_2d8 >> 0x2b) & res3;
            local_151 = local_199;
            if (res3 < 0) {
              local_181 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                          operator()(&last);
              local_198 = &local_220;
              local_220 = ((long)local_181 << 0x1c | local_2d8 >> 0x24) & local_220;
              local_141 = local_181;
              if ((long)local_220 < 0) {
                local_129 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                            operator()(&last);
                local_140 = &res3;
                res3 = ((long)local_129 << 0x23 | local_2d8 >> 0x1d) & res3;
                local_d1 = local_129;
                if (res3 < 0) {
                  local_111 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                              operator()(&last);
                  local_128 = &local_220;
                  local_220 = ((long)local_111 << 0x2a | local_2d8 >> 0x16) & local_220;
                  local_c1 = local_111;
                  if ((long)local_220 < 0) {
                    local_f9 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                               operator()(&last);
                    local_110 = &res3;
                    res3 = ((long)local_f9 << 0x31 | local_2d8 >> 0xf) & res3;
                    local_b1 = local_f9;
                    if (res3 < 0) {
                      local_e1 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                                 operator()(&last);
                      local_f8 = &local_220;
                      local_220 = ((long)local_e1 << 0x38 | local_2d8 >> 8) & local_220;
                      local_a1 = local_e1;
                      if ((long)local_220 < 0) {
                        iVar5 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                                operator()(&last);
                        if (iVar5 != '\x01') {
                          iVar5 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                                  operator()((anon_class_8_1_54a39810 *)&res2);
                          if (((int)iVar5 & 0x80U) != 0) {
                            local_1e8 = (ParseContext *)0x0;
                            goto LAB_004e4f7d;
                          }
                          bVar6 = ShiftMixParseVarint<unsigned_long,_10>::anon_class_8_1_54a39810::
                                  operator()((anon_class_8_1_54a39810 *)&res2);
                          if ((bVar6 & 1) == 0) {
                            local_220 = local_220 ^ 0x8000000000000000;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          res3 = local_220 & res3;
        }
        local_2d8 = res3 & local_2d8;
        if (local_1f0 == (ParseContext *)0x0) {
          protobuf_assumption_failed
                    ("p != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/varint_shuffle.h"
                     ,0x91);
        }
        local_1e8 = local_1f0;
      }
      else {
        local_1e8 = local_1f0;
      }
LAB_004e4f7d:
      local_2c8 = local_1e8;
      *(ulong *)res = local_2d8;
      ctx_local = local_2c8;
      if (local_2c8 == (ParseContext *)0x0) {
        return (char *)0x0;
      }
      if (obj._1_1_ == kBool) {
        local_328->_M_dataplus = (_Alloc_hider)(_size != 0);
      }
      else if (obj._1_1_ == kU32) {
        str._4_4_ = (uint32_t)_size;
        bVar4 = MapTypeCard::is_zigzag((MapTypeCard *)((long)&obj + 2));
        if (bVar4) {
          str._4_4_ = WireFormatLite::ZigZagDecode32(str._4_4_);
        }
        *(uint32_t *)local_328 = str._4_4_;
      }
      else {
        if (obj._1_1_ != kU64) {
          Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                      ,0xad6);
        }
        bVar4 = MapTypeCard::is_zigzag((MapTypeCard *)((long)&obj + 2));
        if (bVar4) {
          _size = WireFormatLite::ZigZagDecode64(_size);
        }
        *(uint64_t *)local_328 = _size;
      }
      break;
    case 1:
      ctx_local = (ParseContext *)ReadFixed<unsigned_long>(local_328,(char *)ctx_local);
      break;
    case 2:
      if (obj._1_1_ == kString) {
        str._0_4_ = ReadSize((char **)&ctx_local);
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        psStack_348 = local_328;
        ctx_local = (ParseContext *)
                    EpsCopyInputStream::ReadString
                              ((EpsCopyInputStream *)&aux_local->enum_range,(char *)ctx_local,
                               (uint32_t)str,local_328);
        if (ctx_local == (ParseContext *)0x0) {
          return (char *)0x0;
        }
        local_349 = (inner_tag._3_1_ >> 2 & 1) != 0 || (inner_tag._3_1_ >> 3 & 1) != 0;
        bVar4 = MapTypeCard::is_utf8((MapTypeCard *)((long)&obj + 2));
        if ((bVar4) && ((local_349 & 1) != 0)) {
          auVar16 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psStack_348);
          str_00._M_str = auVar16._8_8_;
          str_00._M_len = (size_t)str_00._M_str;
          local_360 = auVar16;
          bVar4 = utf8_range::IsStructurallyValid(auVar16._0_8_,str_00);
          if (!bVar4) {
            local_370 = MessageName(table);
            _absl_log_internal_check_op_result = FieldName(table,pFStack_310);
            message_name._M_str = absl_log_internal_check_op_result;
            message_name._M_len = (size_t)local_370._M_str;
            field_name._M_str = "parsing";
            field_name._M_len = (size_t)local_378;
            PrintUTF8ErrorLog((internal *)local_370._M_len,message_name,field_name,(char *)0x0,
                              (bool)in_stack_fffffffffffffb58);
            if ((inner_tag._3_1_ >> 2 & 1) != 0) {
              return (char *)0x0;
            }
          }
        }
      }
      else {
        iVar8 = absl::lts_20250127::log_internal::GetReferenceableValue((uint)obj._1_1_);
        iVar9 = absl::lts_20250127::log_internal::GetReferenceableValue(6);
        local_388 = absl::lts_20250127::log_internal::Check_EQImpl
                              (iVar8,iVar9,
                               "static_cast<int>(type_kind) == static_cast<int>(UntypedMapBase::TypeKind::kMessage)"
                              );
        if (local_388 != (Nullable<const_char_*>)0x0) {
          pcVar11 = absl::lts_20250127::implicit_cast<char_const*>(local_388);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_3a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                     ,0xaf4,pcVar11);
          pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_3a0);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_389,pLVar12);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_3a0);
        }
        local_3bc = absl::lts_20250127::log_internal::GetReferenceableValue(obj._4_4_);
        local_3bd = absl::lts_20250127::log_internal::GetReferenceableValue(type_kind);
        local_3b8 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_int,unsigned_char>
                              (&local_3bc,&local_3bd,"inner_tag == value_tag");
        pPVar2 = ctx_local;
        this = aux_local;
        if (local_3b8 != (Nullable<const_char_*>)0x0) {
          pcVar11 = absl::lts_20250127::implicit_cast<char_const*>(local_3b8);
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_3d0,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                     ,0xaf5,pcVar11);
          pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_3d0);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_3be,pLVar12);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_3d0);
        }
        local_3e8 = &local_328;
        local_3e0 = &aux_local;
        local_3d8 = &table_local;
        pppsStack_278 = &local_3e8;
        EpsCopyInputStream::LimitToken::LimitToken(&local_27c);
        local_230 = this;
        local_238 = pPVar2;
        unique0x10000cee = &local_27c;
        local_248._4_4_ = ReadSize((char **)&local_238);
        if ((local_238 == (ParseContext *)0x0) || (this[0xb].enum_range.first < 1)) {
          local_228 = (ParseContext *)0x0;
        }
        else {
          EpsCopyInputStream::PushLimit
                    ((EpsCopyInputStream *)local_248,(char *)&this->offset,(int)local_238);
          EpsCopyInputStream::LimitToken::operator=(stack0xfffffffffffffdc0,(LimitToken *)local_248)
          ;
          EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)local_248);
          this[0xb].enum_range.first = this[0xb].enum_range.first + -1;
          local_228 = local_238;
        }
        if (local_228 == (ParseContext *)0x0) {
          local_260 = local_228;
        }
        else {
          absl_log_internal_check_op_result_2._4_4_ = this[0xb].enum_range.first;
          local_98 = pppsStack_278;
          local_a0 = local_228;
          local_70 = **pppsStack_278;
          local_80 = (ParseContext *)*pppsStack_278[1];
          local_78 = local_228;
          local_88 = (TcParseTableBase *)((*pppsStack_278[2])->_M_string_length + 0x38);
          do {
            bVar4 = ParseContext::Done(local_80,(char **)&local_78);
            psVar3 = local_70;
            p = local_78;
            pPVar2 = local_80;
            if (((bVar4 ^ 0xffU) & 1) == 0) break;
            TcFieldData::TcFieldData(&local_90);
            pTVar15 = local_88;
            this_00 = (TcParseTableBase *)((long)local_88 + -0x38);
            uVar7 = UnalignedLoad<unsigned_short>((char *)p);
            uVar13 = (ulong)(int)((uint)uVar7 & (uint)*(byte *)((long)pTVar15 + -0x30));
            if ((uVar13 & 7) != 0) {
              protobuf_assumption_failed
                        ("(idx & 7) == 0",
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                         ,0x452);
            }
            data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                           TcParseTableBase::fast_entry(this_00,uVar13 >> 3);
            local_58.data =
                 ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data.field_0 + 8))->data ^
                 (ulong)uVar7;
            p_Var14 = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data.field_0);
            local_60.data = local_58.data;
            local_78 = (ParseContext *)
                       (*p_Var14)((MessageLite *)psVar3,(char *)p,pPVar2,(TcFieldData)local_58,
                                  this_00,0);
            if (local_78 == (ParseContext *)0x0) break;
            uVar10 = EpsCopyInputStream::LastTag(&local_80->super_EpsCopyInputStream);
          } while (uVar10 == 1);
          pTVar15 = (TcParseTableBase *)((long)local_88 + -0x38);
          if ((undefined1  [56])((undefined1  [56])*local_88 & (undefined1  [56])0x100) ==
              (undefined1  [56])0x0) {
            local_88 = pTVar15;
            if (local_78 == (ParseContext *)0x0) {
              VerifyHasBitConsistency((MessageLite *)local_70,pTVar15);
            }
            local_68 = local_78;
          }
          else {
            puVar1 = (undefined8 *)((long)local_88 + -0x10);
            local_88 = pTVar15;
            local_68 = (ParseContext *)(*(code *)*puVar1)(local_70,local_78,local_80);
          }
          local_260 = local_68;
          if (local_68 != (ParseContext *)0x0) {
            iVar8 = absl::lts_20250127::log_internal::GetReferenceableValue
                              (absl_log_internal_check_op_result_2._4_4_);
            iVar9 = absl::lts_20250127::log_internal::GetReferenceableValue
                              (this[0xb].enum_range.first);
            local_2a0 = absl::lts_20250127::log_internal::Check_EQImpl
                                  (iVar8,iVar9,"old_depth == depth_");
            if (local_2a0 != (Nullable<const_char_*>)0x0) {
              pcVar11 = absl::lts_20250127::implicit_cast<char_const*>(local_2a0);
              absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&local_2b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                         ,0x481,pcVar11);
              pLVar12 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_2b8);
              absl::lts_20250127::log_internal::Voidify::operator&&(&local_2a1,pLVar12);
              absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                        ((LogMessageFatal *)&local_2b8);
            }
            local_2a0 = (Nullable<const_char_*>)0x0;
          }
          this[0xb].enum_range.first = this[0xb].enum_range.first + 1;
          EpsCopyInputStream::LimitToken::LimitToken(&local_2bc,&local_27c);
          bVar4 = EpsCopyInputStream::PopLimit((EpsCopyInputStream *)&this->enum_range,&local_2bc);
          EpsCopyInputStream::LimitToken::~LimitToken(&local_2bc);
          if (((bVar4 ^ 0xffU) & 1) == 0) {
          }
          else {
            local_260 = (ParseContext *)0x0;
          }
        }
        local_290 = 1;
        EpsCopyInputStream::LimitToken::~LimitToken(&local_27c);
        ctx_local = local_260;
        if (local_260 == (ParseContext *)0x0) {
          return (char *)0x0;
        }
      }
      break;
    default:
      Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                  ,0xafe);
    case 5:
      ctx_local = (ParseContext *)ReadFixed<unsigned_int>(local_328,(char *)ctx_local);
    }
  } while( true );
}

Assistant:

const char* TcParser::ParseOneMapEntry(
    NodeBase* node, const char* ptr, ParseContext* ctx,
    const TcParseTableBase::FieldAux* aux, const TcParseTableBase* table,
    const TcParseTableBase::FieldEntry& entry, UntypedMapBase& map) {
  using WFL = WireFormatLite;

  const auto map_info = aux[0].map_info;
  const uint8_t key_tag = map_info.key_type_card.tag();
  const uint8_t value_tag = map_info.value_type_card.tag();

  while (!ctx->Done(&ptr)) {
    uint32_t inner_tag = ptr[0];

    if (ABSL_PREDICT_FALSE(inner_tag != key_tag && inner_tag != value_tag)) {
      // Do a full parse and check again in case the tag has non-canonical
      // encoding.
      ptr = ReadTag(ptr, &inner_tag);
      if (ABSL_PREDICT_FALSE(inner_tag != key_tag && inner_tag != value_tag)) {
        if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;

        if (inner_tag == 0 || (inner_tag & 7) == WFL::WIRETYPE_END_GROUP) {
          ctx->SetLastTag(inner_tag);
          break;
        }

        ptr = UnknownFieldParse(inner_tag, nullptr, ptr, ctx);
        if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
        continue;
      }
    } else {
      ++ptr;
    }

    MapTypeCard type_card;
    UntypedMapBase::TypeKind type_kind;
    void* obj;
    if (inner_tag == key_tag) {
      type_card = map_info.key_type_card;
      type_kind = map.type_info().key_type_kind();
      obj = node->GetVoidKey();
    } else {
      type_card = map_info.value_type_card;
      type_kind = map.type_info().value_type_kind();
      obj = map.GetVoidValue(node);
    }

    switch (inner_tag & 7) {
      case WFL::WIRETYPE_VARINT:
        uint64_t tmp;
        ptr = ParseVarint(ptr, &tmp);
        if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
        switch (type_kind) {
          case UntypedMapBase::TypeKind::kBool:
            *reinterpret_cast<bool*>(obj) = static_cast<bool>(tmp);
            continue;
          case UntypedMapBase::TypeKind::kU32: {
            uint32_t v = static_cast<uint32_t>(tmp);
            if (type_card.is_zigzag()) v = WFL::ZigZagDecode32(v);
            memcpy(obj, &v, sizeof(v));
            continue;
          }
          case UntypedMapBase::TypeKind::kU64:
            if (type_card.is_zigzag()) tmp = WFL::ZigZagDecode64(tmp);
            memcpy(obj, &tmp, sizeof(tmp));
            continue;
          default:
            Unreachable();
        }
      case WFL::WIRETYPE_FIXED32:
        ptr = ReadFixed<uint32_t>(obj, ptr);
        continue;
      case WFL::WIRETYPE_FIXED64:
        ptr = ReadFixed<uint64_t>(obj, ptr);
        continue;
      case WFL::WIRETYPE_LENGTH_DELIMITED:
        if (type_kind == UntypedMapBase::TypeKind::kString) {
          const int size = ReadSize(&ptr);
          if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          std::string* str = reinterpret_cast<std::string*>(obj);
          ptr = ctx->ReadString(ptr, size, str);
          if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          bool do_utf8_check = map_info.fail_on_utf8_failure;
#ifndef NDEBUG
          do_utf8_check |= map_info.log_debug_utf8_failure;
#endif
          if (type_card.is_utf8() && do_utf8_check &&
              !utf8_range::IsStructurallyValid(*str)) {
            PrintUTF8ErrorLog(MessageName(table), FieldName(table, &entry),
                              "parsing", false);
            if (map_info.fail_on_utf8_failure) {
              return nullptr;
            }
          }
          continue;
        } else {
          ABSL_DCHECK_EQ(static_cast<int>(type_kind),
                         static_cast<int>(UntypedMapBase::TypeKind::kMessage));
          ABSL_DCHECK_EQ(inner_tag, value_tag);
          ptr = ctx->ParseLengthDelimitedInlined(ptr, [&](const char* ptr) {
            return ParseLoop(reinterpret_cast<MessageLite*>(obj), ptr, ctx,
                             aux[1].table);
          });
          if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
          continue;
        }
      default:
        Unreachable();
    }
  }
  return ptr;
}